

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

bool FS_ChangeMusic(char *string)

{
  bool bVar1;
  int iVar2;
  char local_48 [8];
  char buffer [40];
  char *string_local;
  
  iVar2 = FWadCollection::CheckNumForName(&Wads,string,0x10);
  if ((iVar2 < 0) || (bVar1 = S_ChangeMusic(string,1,true,false), !bVar1)) {
    mysnprintf(local_48,0x28,"O_%s");
    iVar2 = FWadCollection::CheckNumForName(&Wads,local_48,0x10);
    if ((iVar2 < 0) || (bVar1 = S_ChangeMusic(local_48,1,true,false), !bVar1)) {
      mysnprintf(local_48,0x28,"D_%s");
      iVar2 = FWadCollection::CheckNumForName(&Wads,local_48,0x10);
      if (iVar2 < 0) {
        S_ChangeMusic((char *)0x0,0,true,false);
        return false;
      }
      S_ChangeMusic(local_48,1,true,false);
    }
  }
  return true;
}

Assistant:

bool FS_ChangeMusic(const char * string)
{
	char buffer[40];

	if (Wads.CheckNumForName(string, ns_music)<0 || !S_ChangeMusic(string,true))
	{
		// Retry with O_ prepended to the music name, then with D_
		mysnprintf(buffer, countof(buffer), "O_%s", string);
		if (Wads.CheckNumForName(buffer, ns_music)<0 || !S_ChangeMusic(buffer,true))
		{
			mysnprintf(buffer, countof(buffer), "D_%s", string);
			if (Wads.CheckNumForName(buffer, ns_music)<0) 
			{
				S_ChangeMusic(NULL, 0);
				return false;
			}
			else S_ChangeMusic(buffer,true);
		}
	}
	return true;
}